

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::student_t_dist<float>::pdf(student_t_dist<float> *this,result_type_conflict1 x)

{
  int iVar1;
  int iVar2;
  param_type *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  result_type_conflict1 norm;
  
  param_type::nu(in_RDI);
  fVar3 = math::ln_Gamma(0.0);
  param_type::nu(in_RDI);
  fVar4 = math::ln_Gamma(0.0);
  dVar5 = std::exp((double)(ulong)(uint)(fVar3 - fVar4));
  iVar1 = param_type::nu(in_RDI);
  dVar6 = std::sqrt((double)(ulong)(uint)((float)iVar1 * 3.1415927));
  iVar1 = param_type::nu(in_RDI);
  uVar8 = 0;
  iVar2 = param_type::nu(in_RDI);
  dVar7 = std::pow((double)(ulong)(uint)((in_XMM0_Da * in_XMM0_Da) / (float)iVar1 + 1.0),
                   (double)CONCAT44(uVar8,(float)(iVar2 + 1) / -2.0));
  return (SUB84(dVar5,0) / SUB84(dVar6,0)) * SUB84(dVar7,0);
}

Assistant:

pdf(result_type x) const {
      const result_type norm{math::exp(math::ln_Gamma((P.nu() + 1) / result_type(2)) -
                                       math::ln_Gamma(P.nu() / result_type(2))) /
                             math::sqrt(math::constants<result_type>::pi * P.nu())};
      return norm * math::pow(1 + x * x / P.nu(), (P.nu() + 1) / result_type(-2));
    }